

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dsatur.cpp
# Opt level: O0

void __thiscall Dsatur::assignColor(Dsatur *this,Node *node)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  reference ppNVar4;
  reference this_00;
  allocator<Node_*> local_89;
  vector<Node_*,_std::allocator<Node_*>_> local_88;
  Node *local_60;
  Node *neighbor;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_50;
  iterator __end2;
  iterator __begin2;
  vector<Node_*,_std::allocator<Node_*>_> *__range2;
  bool assignIt;
  Node *pNStack_18;
  int color;
  Node *node_local;
  Dsatur *this_local;
  
  pNStack_18 = node;
  node_local = (Node *)this;
  for (__range2._4_4_ = 1; __range2._4_4_ <= this->number_of_colors_used;
      __range2._4_4_ = __range2._4_4_ + 1) {
    bVar1 = true;
    Node::getNeighbors((vector<Node_*,_std::allocator<Node_*>_> *)&__begin2,pNStack_18);
    __end2 = std::vector<Node_*,_std::allocator<Node_*>_>::begin
                       ((vector<Node_*,_std::allocator<Node_*>_> *)&__begin2);
    local_50._M_current =
         (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end
                            ((vector<Node_*,_std::allocator<Node_*>_> *)&__begin2);
    while (bVar2 = __gnu_cxx::operator!=(&__end2,&local_50), bVar2) {
      ppNVar4 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                ::operator*(&__end2);
      local_60 = *ppNVar4;
      iVar3 = Node::getAssignedColor(local_60);
      if ((iVar3 != -1) && (iVar3 = Node::getAssignedColor(local_60), iVar3 == __range2._4_4_)) {
        bVar1 = false;
        break;
      }
      __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
      operator++(&__end2);
    }
    neighbor._4_4_ = 5;
    std::vector<Node_*,_std::allocator<Node_*>_>::~vector
              ((vector<Node_*,_std::allocator<Node_*>_> *)&__begin2);
    if (bVar1) break;
  }
  Node::setAssignedColor(pNStack_18,__range2._4_4_);
  if (this->number_of_colors_used < __range2._4_4_) {
    this->number_of_colors_used = __range2._4_4_;
    std::allocator<Node_*>::allocator(&local_89);
    std::vector<Node_*,_std::allocator<Node_*>_>::vector
              (&local_88,1,&stack0xffffffffffffffe8,&local_89);
    std::
    vector<std::vector<Node_*,_std::allocator<Node_*>_>,_std::allocator<std::vector<Node_*,_std::allocator<Node_*>_>_>_>
    ::push_back(&this->classes,&local_88);
    std::vector<Node_*,_std::allocator<Node_*>_>::~vector(&local_88);
    std::allocator<Node_*>::~allocator(&local_89);
  }
  else {
    this_00 = std::
              vector<std::vector<Node_*,_std::allocator<Node_*>_>,_std::allocator<std::vector<Node_*,_std::allocator<Node_*>_>_>_>
              ::operator[](&this->classes,(long)(__range2._4_4_ + -1));
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back(this_00,&stack0xffffffffffffffe8);
  }
  return;
}

Assistant:

void Dsatur::assignColor(Node *node) {

    int color = 1;
    for(;color<=number_of_colors_used;color++){
        bool assignIt = true;
        for(auto neighbor:node->getNeighbors()){
            if(neighbor->getAssignedColor()!=-1 && neighbor->getAssignedColor() == color){
                assignIt = false;
                break;
            }
        }

        if(assignIt)
            break;
    }

    node->setAssignedColor(color);

    if(color > number_of_colors_used) {
        number_of_colors_used = color;
        classes.push_back(std::vector<Node*>(1,node));
    }else{
        classes[color-1].push_back(node);
    }

}